

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::numericalRoot<double>(double value,int power)

{
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  double local_8;
  
  switch(in_EDI) {
  case 0:
    local_8 = 1.0;
    break;
  case 1:
    local_8 = in_XMM0_Qa;
    break;
  case 2:
    if (0.0 <= in_XMM0_Qa) {
      local_8 = sqrt(in_XMM0_Qa);
    }
    else {
      local_8 = NAN;
    }
    break;
  case 3:
    local_8 = cbrt(in_XMM0_Qa);
    break;
  case 4:
    if (0.0 <= in_XMM0_Qa) {
      dVar1 = sqrt(in_XMM0_Qa);
      local_8 = sqrt(dVar1);
    }
    else {
      local_8 = NAN;
    }
    break;
  case -4:
    if (0.0 <= in_XMM0_Qa) {
      dVar1 = sqrt(1.0 / in_XMM0_Qa);
      local_8 = sqrt(dVar1);
    }
    else {
      local_8 = NAN;
    }
    break;
  case -3:
    local_8 = cbrt(1.0 / in_XMM0_Qa);
    break;
  case -2:
    if (0.0 <= in_XMM0_Qa) {
      local_8 = sqrt(1.0 / in_XMM0_Qa);
    }
    else {
      local_8 = NAN;
    }
    break;
  case -1:
    local_8 = 1.0 / in_XMM0_Qa;
    break;
  default:
    if ((0.0 <= in_XMM0_Qa) || (in_EDI % 2 != 0)) {
      local_8 = pow(in_XMM0_Qa,1.0 / (double)in_EDI);
    }
    else {
      local_8 = NAN;
    }
  }
  return local_8;
}

Assistant:

X numericalRoot(X value, int power)
{
    switch (power) {
        case 0:
            return X{1.0};
        case 1:
            return value;
        case -1:
            return X{1.0} / value;
        case 2:
            if (value < X{0.0}) {
                return constants::invalid_conversion;
            }
            return std::sqrt(value);
        case -2:
            if (value < X{0.0}) {
                return constants::invalid_conversion;
            }
            return std::sqrt(X{1.0} / value);
        case 3:
            return std::cbrt(value);
        case -3:
            return std::cbrt(X{1.0} / value);
        case 4:
            if (value < X{0.0}) {
                return constants::invalid_conversion;
            }
            return std::sqrt(std::sqrt(value));
        case -4:
            if (value < X{0.0}) {
                return constants::invalid_conversion;
            }
            return std::sqrt(std::sqrt(X{1.0} / value));
        default:
            if (value < X{0.0} && power % 2 == 0) {
                return constants::invalid_conversion;
            }
            return std::pow(value, X{1.0} / static_cast<X>(power));
    }
}